

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puthread-posix.c
# Opt level: O3

ppointer p_uthread_get_local(PUThreadKey *key)

{
  pthread_key_t *ppVar1;
  void *pvVar2;
  
  if (key != (PUThreadKey *)0x0) {
    ppVar1 = pp_uthread_get_tls_key(key);
    if (ppVar1 != (pthread_key_t *)0x0) {
      pvVar2 = pthread_getspecific(*ppVar1);
      return pvVar2;
    }
  }
  return (ppointer)0x0;
}

Assistant:

P_LIB_API ppointer
p_uthread_get_local (PUThreadKey *key)
{
	pthread_key_t	*tls_key;
#ifdef P_OS_SCO
	ppointer	value;
#endif

	if (P_UNLIKELY (key == NULL))
		return NULL;

	if (P_UNLIKELY ((tls_key = pp_uthread_get_tls_key (key)) == NULL))
		return NULL;

#ifdef P_OS_SCO
	if (P_UNLIKELY (pthread_getspecific (*tls_key, &value) != 0))
		return NULL;

	return value;
#else
	return pthread_getspecific (*tls_key);
#endif
}